

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  xpath_value_type xVar1;
  xpath_variable_set *this_01;
  char_t *pcVar2;
  size_t sVar3;
  bool *pbVar4;
  double dVar5;
  char cVar6;
  byte bVar7;
  nodetest_t nVar8;
  size_t length;
  byte *pbVar9;
  xpath_ast_node *pxVar10;
  xpath_variable *__dest;
  char_t *pcVar11;
  xpath_ast_node *pxVar12;
  xpath_ast_node *pxVar13;
  xpath_parse_result *pxVar14;
  ulong uVar15;
  anon_union_8_5_7bd254c6_for__data aVar16;
  long lVar17;
  bool bVar18;
  lexeme_t lVar19;
  char *pcVar20;
  long lVar21;
  anon_union_8_5_7bd254c6_for__data *paVar22;
  ulong uVar23;
  anon_union_8_5_7bd254c6_for__data *paVar24;
  size_t __n;
  xpath_ast_node *args [2];
  bool local_59;
  anon_union_8_5_7bd254c6_for__data local_48;
  xpath_ast_node *pxStack_40;
  
  lVar19 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar19 - lex_minus) {
switchD_0036d978_caseD_9:
    pxVar10 = parse_location_path(this);
    return pxVar10;
  }
  this_00 = &this->_lexer;
  switch(lVar19) {
  case lex_minus:
    xpath_lexer::next(this_00);
    pxVar10 = parse_expression(this,7);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x0e';
    pxVar12->_rettype = '\x02';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
    pxVar12->_left = pxVar10;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    return pxVar12;
  default:
    goto switchD_0036d978_caseD_9;
  case lex_var_ref:
switchD_0036d978_caseD_b:
    this_01 = this->_variables;
    if (this_01 == (xpath_variable_set *)0x0) {
      pxVar14 = this->_result;
      pcVar20 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar23 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      pcVar11 = this->_scratch;
      if ((0x1f < uVar23) &&
         (pcVar11 = (char_t *)
                    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                              allocate)(uVar23 + 1), pcVar11 == (char_t *)0x0)) {
LAB_0036dd21:
        pbVar4 = this->_alloc->_error;
        if (pbVar4 != (bool *)0x0) {
          *pbVar4 = true;
          return (xpath_ast_node *)0x0;
        }
        __assert_fail("_alloc->_error",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2c5f,
                      "xpath_ast_node *pugi::impl::(anonymous namespace)::xpath_parser::error_oom()"
                     );
      }
      memcpy(pcVar11,pcVar2,uVar23);
      pcVar11[uVar23] = '\0';
      __dest = xpath_variable_set::_find(this_01,pcVar11);
      if (pcVar11 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar11);
      }
      if (__dest != (xpath_variable *)0x0) {
        xpath_lexer::next(this_00);
        xVar1 = __dest->_type;
        pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar12->_type = '\x14';
        pxVar12->_rettype = (char)xVar1;
        pxVar12->_axis = '\0';
        pxVar12->_test = '\0';
        goto LAB_0036dc3c;
      }
      pxVar14 = this->_result;
      pcVar20 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_0036d978_caseD_c:
    xpath_lexer::next(this_00);
    pxVar12 = parse_expression(this,0);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_00);
      goto LAB_0036dc50;
    }
    pxVar14 = this->_result;
    pcVar20 = "Expected \')\' to match an opening \'(\'";
    break;
  case lex_quoted_string:
switchD_0036d978_caseD_e:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar2 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x3fd4cd;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
      *(char *)((long)__dest + __n) = '\0';
    }
    xpath_lexer::next(this_00);
    pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x12';
    pxVar12->_rettype = '\x03';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
LAB_0036dc3c:
    pxVar12->_left = (xpath_ast_node *)0x0;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    (pxVar12->_data).string = (char_t *)__dest;
    goto LAB_0036dc50;
  case lex_number:
switchD_0036d978_caseD_f:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar23 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
    pcVar11 = this->_scratch;
    if ((0x1f < uVar23) &&
       (pcVar11 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar23 + 1), pcVar11 == (char_t *)0x0)) goto LAB_0036dd21;
    memcpy(pcVar11,pcVar2,uVar23);
    pcVar11[uVar23] = '\0';
    dVar5 = convert_string_to_number(pcVar11);
    if (pcVar11 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar11);
    }
    xpath_lexer::next(this_00);
    pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x13';
    pxVar12->_rettype = '\x02';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
    pxVar12->_left = (xpath_ast_node *)0x0;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    (pxVar12->_data).number = dVar5;
LAB_0036dc50:
    sVar3 = this->_depth;
    lVar19 = (this->_lexer)._cur_lexeme;
    while (lVar19 == lex_open_square_brace) {
      xpath_lexer::next(this_00);
      uVar23 = this->_depth + 1;
      this->_depth = uVar23;
      if (0x400 < uVar23) {
        pxVar14 = this->_result;
        pcVar20 = "Exceeded maximum allowed query depth";
        goto LAB_0036dde0;
      }
      if (pxVar12->_rettype != '\x01') {
        pxVar14 = this->_result;
        pcVar20 = "Predicate has to be applied to node set";
        goto LAB_0036dde0;
      }
      pxVar10 = parse_expression(this,0);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar13 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar13 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar13->_type = '\x11';
      pxVar13->_rettype = '\x01';
      pxVar13->_axis = '\0';
      pxVar13->_test = '\0';
      pxVar13->_left = pxVar12;
      pxVar13->_right = pxVar10;
      pxVar13->_next = (xpath_ast_node *)0x0;
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar14 = this->_result;
        pcVar20 = "Expected \']\' to match an opening \'[\'";
        goto LAB_0036dde0;
      }
      xpath_lexer::next(this_00);
      pxVar12 = pxVar13;
      lVar19 = (this->_lexer)._cur_lexeme;
    }
    this->_depth = sVar3;
    if (lVar19 != lex_double_slash) {
      if (lVar19 != lex_slash) {
        return pxVar12;
      }
      xpath_lexer::next(this_00);
      pxVar10 = pxVar12;
LAB_0036dd7b:
      pxVar10 = parse_relative_location_path(this,pxVar10);
      return pxVar10;
    }
    xpath_lexer::next(this_00);
    if (pxVar12->_rettype == '\x01') {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '8';
      pxVar10->_rettype = '\x01';
      pxVar10->_axis = '\x05';
      pxVar10->_test = '\x02';
      pxVar10->_left = pxVar12;
      pxVar10->_right = (xpath_ast_node *)0x0;
      pxVar10->_next = (xpath_ast_node *)0x0;
      (pxVar10->_data).string = (char_t *)0x0;
      goto LAB_0036dd7b;
    }
    pxVar14 = this->_result;
    pcVar20 = "Step has to be applied to node set";
    break;
  case lex_string:
    pbVar9 = (byte *)this_00->_cur;
    do {
      bVar7 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar7] & 8) != 0);
    if ((bVar7 != 0x28) ||
       (nVar8 = parse_node_test_type
                          ((xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin,
                           (xpath_lexer_string *)(this->_lexer)._cur_lexeme_contents.end),
       nVar8 != nodetest_none)) goto switchD_0036d978_caseD_9;
    switch(lVar19) {
    case lex_var_ref:
      goto switchD_0036d978_caseD_b;
    case lex_open_brace:
      goto switchD_0036d978_caseD_c;
    default:
      pxVar14 = this->_result;
      pcVar20 = "Unrecognizable primary expression";
      break;
    case lex_quoted_string:
      goto switchD_0036d978_caseD_e;
    case lex_number:
      goto switchD_0036d978_caseD_f;
    case lex_string:
      goto switchD_0036da28_caseD_14;
    }
  }
LAB_0036dde0:
  pxVar14->error = pcVar20;
LAB_0036dde3:
  pxVar14->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
switchD_0036da28_caseD_14:
  local_48.string = (char_t *)0x0;
  pxStack_40 = (xpath_ast_node *)0x0;
  pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
  pcVar11 = (this->_lexer)._cur_lexeme_contents.end;
  xpath_lexer::next(this_00);
  if ((this->_lexer)._cur_lexeme != lex_open_brace) {
    pcVar20 = "Unrecognized function call";
    goto switchD_0036df08_caseD_64;
  }
  xpath_lexer::next(this_00);
  sVar3 = this->_depth;
  lVar19 = (this->_lexer)._cur_lexeme;
  uVar23 = 0;
  aVar16.string = (char_t *)0x0;
  pxVar10 = (xpath_ast_node *)0x0;
  if (lVar19 != lex_close_brace) {
    paVar24 = &local_48;
    uVar23 = 0;
    pxVar12 = (xpath_ast_node *)0x0;
    do {
      if (uVar23 != 0) {
        if (lVar19 != lex_comma) {
          pcVar20 = "No comma between function arguments";
          goto switchD_0036df08_caseD_64;
        }
        xpath_lexer::next(this_00);
      }
      uVar15 = this->_depth + 1;
      this->_depth = uVar15;
      if (0x400 < uVar15) {
        pcVar20 = "Exceeded maximum allowed query depth";
        goto switchD_0036df08_caseD_64;
      }
      pxVar10 = parse_expression(this,0);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      paVar22 = (anon_union_8_5_7bd254c6_for__data *)&pxVar12->_next;
      if (uVar23 < 2) {
        paVar22 = paVar24;
      }
      paVar22->variable = (xpath_variable *)pxVar10;
      uVar23 = uVar23 + 1;
      lVar19 = (this->_lexer)._cur_lexeme;
      paVar24 = paVar24 + 1;
      aVar16 = local_48;
      pxVar12 = pxVar10;
      pxVar10 = pxStack_40;
    } while (lVar19 != lex_close_brace);
  }
  xpath_lexer::next(this_00);
  this->_depth = sVar3;
  pcVar20 = "Unrecognized function or wrong parameter count";
  switch(*pcVar2) {
  case 'b':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("boolean"[lVar21] != pcVar2[lVar21]) goto switchD_0036df08_caseD_64;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 1) && ("boolean"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '-';
      pxVar12->_rettype = '\x04';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e8e3;
    }
    break;
  case 'c':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("pos == count"[lVar21 + 7] != pcVar2[lVar21]) goto LAB_0036e51f;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 != 1) || ("pos == count"[lVar17 + 7] != '\0')) {
LAB_0036e51f:
      if (pcVar11 != pcVar2) {
        lVar21 = 0;
        do {
          if ("contains"[lVar21] != pcVar2[lVar21]) goto LAB_0036e577;
          lVar21 = lVar21 + 1;
        } while (lVar17 != lVar21);
      }
      if ((uVar23 == 2) && ("contains"[lVar17] == '\0')) {
        pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar12->_type = '#';
        pxVar12->_rettype = '\x04';
        pxVar12->_axis = '\0';
        pxVar12->_test = '\0';
      }
      else {
LAB_0036e577:
        if (pcVar11 != pcVar2) {
          lVar21 = 0;
          do {
            if ("concat"[lVar21] != pcVar2[lVar21]) goto LAB_0036e785;
            lVar21 = lVar21 + 1;
          } while (lVar17 != lVar21);
        }
        if ((uVar23 < 2) || ("concat"[lVar17] != '\0')) {
LAB_0036e785:
          if (pcVar11 != pcVar2) {
            lVar21 = 0;
            do {
              if ("ceiling"[lVar21] != pcVar2[lVar21]) goto LAB_0036eab2;
              lVar21 = lVar21 + 1;
            } while (lVar17 != lVar21);
          }
          pcVar20 = "Unrecognized function or wrong parameter count";
          if (uVar23 == 1 && "ceiling"[lVar17] == '\0') {
            pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar12 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar12->_type = '6';
            pxVar12->_rettype = '\x02';
            pxVar12->_axis = '\0';
            pxVar12->_test = '\0';
            goto LAB_0036e8e3;
          }
          break;
        }
        pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar12->_type = '!';
        pxVar12->_rettype = '\x03';
        pxVar12->_axis = '\0';
        pxVar12->_test = '\0';
      }
LAB_0036ea2a:
      pxVar12->_left = (xpath_ast_node *)aVar16;
      pxVar12->_right = pxVar10;
LAB_0036ea37:
      pxVar12->_next = (xpath_ast_node *)0x0;
      goto LAB_0036dc50;
    }
    if (*(byte *)((long)&(aVar16.variable)->_type + 1) != 1) goto LAB_0036eaba;
    pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x17';
    pxVar12->_rettype = '\x02';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
    goto LAB_0036e8e3;
  case 'f':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("false"[lVar21] != pcVar2[lVar21]) goto LAB_0036e353;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 0) && ("false"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '0';
      pxVar12->_rettype = '\x04';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
LAB_0036e415:
      pxVar12->_left = (xpath_ast_node *)0x0;
      pxVar12->_right = (xpath_ast_node *)0x0;
      goto LAB_0036ea37;
    }
LAB_0036e353:
    if (pcVar11 != pcVar2) {
      lVar21 = 0;
      do {
        if ("floor"[lVar21] != pcVar2[lVar21]) goto switchD_0036df08_caseD_64;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 1) && ("floor"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '5';
      pxVar12->_rettype = '\x02';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e8e3;
    }
    break;
  case 'i':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("info:id"[lVar21 + 5] != pcVar2[lVar21]) goto switchD_0036df08_caseD_64;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 1) && ("info:id"[lVar17 + 5] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '\x18';
      pxVar12->_rettype = '\x01';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e8e3;
    }
    break;
  case 'l':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("last"[lVar21] != pcVar2[lVar21]) goto LAB_0036e5e7;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 0) && ("last"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '\x15';
      pxVar12->_rettype = '\x02';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e415;
    }
LAB_0036e5e7:
    if (pcVar11 != pcVar2) {
      lVar21 = 0;
      do {
        if ("xml:lang"[lVar21 + 4] != pcVar2[lVar21]) goto LAB_0036e7f3;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 1) && ("xml:lang"[lVar17 + 4] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '1';
      pxVar12->_rettype = '\x04';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e8e3;
    }
LAB_0036e7f3:
    if (pcVar11 != pcVar2) {
      lVar21 = 0;
      do {
        if ("local-name"[lVar21] != pcVar2[lVar21]) goto LAB_0036eab2;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if (uVar23 < 2) {
      pcVar20 = "Unrecognized function or wrong parameter count";
      if ("local-name"[lVar17] == '\0') {
        if ((uVar23 == 1) && (*(byte *)((long)&(aVar16.variable)->_type + 1) != 1))
        goto LAB_0036eaba;
        pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar6 = '\x1a' - (uVar23 == 0);
        goto LAB_0036e49c;
      }
    }
    else {
LAB_0036eab2:
      pcVar20 = "Unrecognized function or wrong parameter count";
    }
    break;
  case 'n':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("Unknown variable: variable set does not contain the given name"[lVar21 + 0x3a] !=
            pcVar2[lVar21]) goto LAB_0036e42c;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 < 2) &&
       ("Unknown variable: variable set does not contain the given name"[lVar17 + 0x3a] == '\0')) {
      if ((uVar23 != 1) || (*(byte *)((long)&(aVar16.variable)->_type + 1) == 1)) {
        pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar6 = '\x1e';
        goto LAB_0036e49a;
      }
    }
    else {
LAB_0036e42c:
      bVar18 = 1 < uVar23;
      if (pcVar11 != pcVar2) {
        lVar21 = 0;
        do {
          if ("namespace-uri"[lVar21] != pcVar2[lVar21]) goto LAB_0036e4ab;
          lVar21 = lVar21 + 1;
        } while (lVar17 != lVar21);
      }
      if (bVar18 || "namespace-uri"[lVar17] != '\0') {
LAB_0036e4ab:
        if (pcVar11 != pcVar2) {
          lVar21 = 0;
          do {
            if ("normalize-space"[lVar21] != pcVar2[lVar21]) goto LAB_0036e71f;
            lVar21 = lVar21 + 1;
          } while (lVar17 != lVar21);
        }
        if (!bVar18 && "normalize-space"[lVar17] == '\0') {
          pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar12 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar7 = uVar23 == 0 ^ 0x2b;
LAB_0036ea1b:
          pxVar12->_type = bVar7;
          pxVar12->_rettype = '\x03';
          pxVar12->_axis = '\0';
          pxVar12->_test = '\0';
          goto LAB_0036ea2a;
        }
LAB_0036e71f:
        if (pcVar11 != pcVar2) {
          lVar21 = 0;
          do {
            if ("not"[lVar21] != pcVar2[lVar21]) goto LAB_0036e870;
            lVar21 = lVar21 + 1;
          } while (lVar17 != lVar21);
        }
        if ((uVar23 == 1) && ("not"[lVar17] == '\0')) {
          pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar12 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar12->_type = '.';
          pxVar12->_rettype = '\x04';
          pxVar12->_axis = '\0';
          pxVar12->_test = '\0';
          goto LAB_0036e8e3;
        }
LAB_0036e870:
        if (pcVar11 != pcVar2) {
          lVar21 = 0;
          do {
            if ("expr->rettype() == xpath_type_number"[lVar21 + 0x1e] != pcVar2[lVar21])
            goto LAB_0036eab2;
            lVar21 = lVar21 + 1;
          } while (lVar17 != lVar21);
        }
        pcVar20 = "Unrecognized function or wrong parameter count";
        if (!bVar18 && "expr->rettype() == xpath_type_number"[lVar17 + 0x1e] == '\0') {
          pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar12 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar7 = uVar23 == 0 ^ 0x33;
          goto LAB_0036e8d4;
        }
        break;
      }
      if ((uVar23 != 1) || (*(byte *)((long)&(aVar16.variable)->_type + 1) == 1)) {
        pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar6 = '\x1c';
        goto LAB_0036e49a;
      }
    }
LAB_0036eaba:
    pcVar20 = "Function has to be applied to node set";
    break;
  case 'p':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("position"[lVar21] != pcVar2[lVar21]) goto switchD_0036df08_caseD_64;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 0) && ("position"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '\x16';
      pxVar12->_rettype = '\x02';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e415;
    }
    break;
  case 'r':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("round"[lVar21] != pcVar2[lVar21]) goto switchD_0036df08_caseD_64;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 1) && ("round"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '7';
      pxVar12->_rettype = '\x02';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e8e3;
    }
    break;
  case 's':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("UsdPrimvarReader_string"[lVar21 + 0x11] != pcVar2[lVar21]) goto LAB_0036e658;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 < 2) && ("UsdPrimvarReader_string"[lVar17 + 0x11] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      cVar6 = ' ';
LAB_0036e49a:
      cVar6 = cVar6 - (uVar23 == 0);
LAB_0036e49c:
      pxVar12->_type = cVar6;
      pxVar12->_rettype = '\x03';
      pxVar12->_axis = '\0';
    }
    else {
LAB_0036e658:
      pcVar20 = "Unrecognized function or wrong parameter count";
      if (pcVar11 != pcVar2) {
        lVar21 = 0;
        do {
          if ("string-length"[lVar21] != pcVar2[lVar21]) goto LAB_0036e6b4;
          lVar21 = lVar21 + 1;
        } while (lVar17 != lVar21);
      }
      if (1 < uVar23 || "string-length"[lVar17] != '\0') {
LAB_0036e6b4:
        if (pcVar11 != pcVar2) {
          lVar21 = 0;
          do {
            if ("starts-with"[lVar21] != pcVar2[lVar21]) goto LAB_0036e902;
            lVar21 = lVar21 + 1;
          } while (lVar17 != lVar21);
        }
        if ((uVar23 == 2) && ("starts-with"[lVar17] == '\0')) {
          pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar12 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar12->_type = '\"';
          pxVar12->_rettype = '\x04';
          pxVar12->_axis = '\0';
          pxVar12->_test = '\0';
        }
        else {
LAB_0036e902:
          local_59 = uVar23 == 2;
          if (pcVar11 != pcVar2) {
            lVar21 = 0;
            do {
              if ("substring-before"[lVar21] != pcVar2[lVar21]) goto LAB_0036e964;
              lVar21 = lVar21 + 1;
            } while (lVar17 != lVar21);
          }
          if (local_59 && "substring-before"[lVar17] == '\0') {
            pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar12 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar12->_type = '$';
            pxVar12->_rettype = '\x03';
            pxVar12->_axis = '\0';
            pxVar12->_test = '\0';
          }
          else {
LAB_0036e964:
            if (pcVar11 != pcVar2) {
              lVar21 = 0;
              do {
                if ("substring-after"[lVar21] != pcVar2[lVar21]) goto LAB_0036e9c0;
                lVar21 = lVar21 + 1;
              } while (lVar17 != lVar21);
            }
            if (!local_59 || "substring-after"[lVar17] != '\0') {
LAB_0036e9c0:
              if (pcVar11 != pcVar2) {
                lVar21 = 0;
                do {
                  if ("substring"[lVar21] != pcVar2[lVar21]) goto LAB_0036ea44;
                  lVar21 = lVar21 + 1;
                } while (lVar17 != lVar21);
              }
              if (((uVar23 & 0xfffffffffffffffe) == 2) && ("substring"[lVar17] == '\0')) {
                pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar12 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                bVar7 = local_59 ^ 0x27;
                goto LAB_0036ea1b;
              }
LAB_0036ea44:
              if (pcVar11 != pcVar2) {
                lVar21 = 0;
                do {
                  if ("sum"[lVar21] != pcVar2[lVar21]) goto LAB_0036eab2;
                  lVar21 = lVar21 + 1;
                } while (lVar17 != lVar21);
              }
              if (uVar23 != 1) goto LAB_0036eab2;
              if ("sum"[lVar17] == '\0') {
                if (*(byte *)((long)&(aVar16.variable)->_type + 1) != 1) goto LAB_0036eaba;
                pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar12 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                pxVar12->_type = '4';
                pxVar12->_rettype = '\x02';
                pxVar12->_axis = '\0';
                pxVar12->_test = '\0';
                goto LAB_0036e8e3;
              }
              break;
            }
            pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar12 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar12->_type = '%';
            pxVar12->_rettype = '\x03';
            pxVar12->_axis = '\0';
            pxVar12->_test = '\0';
          }
        }
        goto LAB_0036ea2a;
      }
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar7 = uVar23 == 0 ^ 0x29;
LAB_0036e8d4:
      pxVar12->_type = bVar7;
      pxVar12->_rettype = '\x02';
      pxVar12->_axis = '\0';
    }
    pxVar12->_test = '\0';
LAB_0036e8e3:
    pxVar12->_left = (xpath_ast_node *)aVar16;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    goto LAB_0036dc50;
  case 't':
    lVar17 = (long)pcVar11 - (long)pcVar2;
    if (lVar17 != 0) {
      lVar21 = 0;
      do {
        if ("xformOp:translate"[lVar21 + 8] != pcVar2[lVar21]) goto LAB_0036e3b7;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 3) && ("xformOp:translate"[lVar17 + 8] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = ',';
      pxVar12->_rettype = '\x03';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036ea2a;
    }
LAB_0036e3b7:
    if (pcVar11 != pcVar2) {
      lVar21 = 0;
      do {
        if ("true"[lVar21] != pcVar2[lVar21]) goto switchD_0036df08_caseD_64;
        lVar21 = lVar21 + 1;
      } while (lVar17 != lVar21);
    }
    if ((uVar23 == 0) && ("true"[lVar17] == '\0')) {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '/';
      pxVar12->_rettype = '\x04';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      goto LAB_0036e415;
    }
  }
switchD_0036df08_caseD_64:
  pxVar14 = this->_result;
  pxVar14->error = pcVar20;
  goto LAB_0036dde3;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}